

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O3

PolarPosition * ear::toPolarPosition(CartesianPosition position)

{
  double __y;
  double dVar1;
  double dVar2;
  double __x;
  undefined1 auVar3 [16];
  PolarPosition *in_RDI;
  undefined1 in_stack_00000008 [16];
  double in_stack_00000018;
  
  __x = in_stack_00000008._8_8_;
  __y = in_stack_00000008._0_8_;
  dVar1 = atan2(__y,__x);
  dVar2 = hypot(__y,__x);
  dVar2 = atan2(in_stack_00000018,dVar2);
  auVar3._8_4_ = SUB84(dVar2 * 57.29577951308232,0);
  auVar3._0_8_ = dVar1 * -57.29577951308232;
  auVar3._12_4_ = (int)((ulong)(dVar2 * 57.29577951308232) >> 0x20);
  in_RDI->azimuth = dVar1 * -57.29577951308232;
  in_RDI->elevation = (double)auVar3._8_8_;
  in_RDI->distance = SQRT(in_stack_00000018 * in_stack_00000018 + __x * __x + __y * __y);
  return in_RDI;
}

Assistant:

PolarPosition toPolarPosition(CartesianPosition position) {
    auto cart_array = toCartesianVector3d(position);
    return PolarPosition(azimuth(cart_array), elevation(cart_array),
                         distance(cart_array));
  }